

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O0

void __thiscall
GrcErrorItem::GrcErrorItem
          (GrcErrorItem *this,bool fFatal,int nID,GrpLineAndFile *lnf,string *staMsg,
          GdlObject *pgdlObj)

{
  undefined4 in_EDX;
  byte in_SIL;
  undefined4 *in_RDI;
  string *in_R8;
  undefined8 in_R9;
  GrpLineAndFile *in_stack_ffffffffffffffc8;
  GrpLineAndFile *in_stack_ffffffffffffffd0;
  
  *in_RDI = in_EDX;
  *(undefined8 *)(in_RDI + 2) = in_R9;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_R8);
  *(byte *)(in_RDI + 0xc) = in_SIL & 1;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  GrpLineAndFile::GrpLineAndFile(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

GrcErrorItem(bool fFatal, int nID, GrpLineAndFile & lnf, std::string staMsg, GdlObject * pgdlObj)
		:	m_nID(nID),
			m_pgdlObject(pgdlObj),
			m_staMsg(staMsg),
			m_fFatal(fFatal),
			m_fMsgIncludesFatality(false),
			m_lnf(lnf)
	{
	}